

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O1

bool __thiscall
QWidgetTextControl::findNextPrevAnchor
          (QWidgetTextControl *this,QTextCursor *startCursor,bool next,QTextCursor *newAnchor)

{
  long lVar1;
  bool bVar2;
  QArrayData *pQVar3;
  storage_type_conflict *psVar4;
  long lVar5;
  undefined1 auVar6 [8];
  undefined1 *puVar7;
  char cVar8;
  byte bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  MoveMode MVar13;
  storage_type_conflict *psVar14;
  undefined7 in_register_00000011;
  char16_t *tmp_1;
  long lVar15;
  QTypedArrayData<char16_t> *tmp;
  longlong __tmp;
  undefined1 *puVar16;
  QTypedArrayData<char16_t> *tmp_2;
  long in_FS_OFFSET;
  QStringView QVar17;
  QStringView QVar18;
  QStringView QVar19;
  QStringView QVar20;
  MoveMode local_f4;
  QArrayData *local_e0;
  MoveMode local_d8;
  undefined1 *local_c8;
  undefined1 *puStack_c0;
  QArrayData *local_b8;
  storage_type_conflict *psStack_b0;
  long local_a8;
  undefined1 local_98 [8];
  undefined8 uStack_90;
  undefined1 *local_88;
  undefined1 *local_78;
  undefined1 *puStack_70;
  QArrayData *local_68;
  undefined1 *puStack_60;
  undefined1 local_58 [12];
  int iStack_4c;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  if ((int)CONCAT71(in_register_00000011,next) == 0) {
    iVar10 = QTextCursor::selectionStart();
    iVar10 = iVar10 - (uint)(0 < iVar10);
    local_68 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    QTextDocument::findBlock((int)&local_68);
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xffffffffffffffb0 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
    QTextBlock::begin();
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    uStack_90 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
    QTextBlock::end();
    iVar11 = QTextBlock::position();
    if (iVar10 == iVar11) {
      QTextBlock::begin();
      local_88 = (undefined1 *)CONCAT44(local_88._4_4_,(int)local_a8);
      local_98 = (undefined1  [8])local_b8;
      uStack_90 = psStack_b0;
    }
    else {
      do {
        if (local_98 == (undefined1  [8])local_58._0_8_) {
          if ((int)local_88 != (int)local_48) goto LAB_004d04ea;
          local_88 = (undefined1 *)((ulong)local_88 & 0xffffffff00000000);
          local_98 = (undefined1  [8])0x0;
          uStack_90 = (storage_type_conflict *)0x0;
          local_68 = (QArrayData *)0x0;
          puStack_60 = (undefined1 *)((ulong)puStack_60 & 0xffffffff00000000);
        }
        else {
LAB_004d04ea:
          QTextBlock::iterator::operator--((iterator *)local_98);
        }
        if ((int)local_88 == uStack_90._4_4_) break;
        QTextBlock::iterator::fragment();
        iVar11 = QTextFragment::position();
        QTextBlock::iterator::fragment();
        iVar12 = QTextFragment::length();
      } while (iVar10 < iVar12 + iVar11 + -1);
    }
    cVar8 = QTextBlock::isValid();
    if (cVar8 == '\0') {
      local_f4 = ~MoveAnchor;
      local_e0 = (QArrayData *)0x0;
    }
    else {
      local_e0 = (QArrayData *)0x0;
      psVar14 = (storage_type_conflict *)0x0;
      lVar15 = 0;
      do {
        if ((int)local_88 == uStack_90._4_4_) {
          local_f4 = ~MoveAnchor;
        }
        else {
          local_f4 = ~MoveAnchor;
          do {
            local_78 = &DAT_aaaaaaaaaaaaaaaa;
            puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
            QTextBlock::iterator::fragment();
            local_c8 = &DAT_aaaaaaaaaaaaaaaa;
            puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
            QTextFragment::charFormat();
            cVar8 = QTextFormat::boolProperty((int)&local_c8);
            if ((cVar8 == '\0') || (cVar8 = QTextFormat::hasProperty((int)&local_c8), cVar8 == '\0')
               ) {
              if (local_98 == (undefined1  [8])local_58._0_8_) {
                if ((int)local_88 != (int)local_48) goto LAB_004d0696;
                local_98 = (undefined1  [8])0x0;
                uStack_90 = (storage_type_conflict *)0x0;
                local_88 = (undefined1 *)((ulong)local_88 & 0xffffffff00000000);
              }
              else {
LAB_004d0696:
                QTextBlock::iterator::operator--((iterator *)local_98);
              }
              bVar2 = true;
            }
            else {
              iVar10 = QTextFragment::position();
              iVar11 = QTextFragment::length();
              QTextFormat::stringProperty((int)&local_b8);
              lVar5 = local_a8;
              psVar4 = psStack_b0;
              pQVar3 = local_b8;
              local_b8 = local_e0;
              psStack_b0 = psVar14;
              local_a8 = lVar15;
              if (local_e0 != (QArrayData *)0x0) {
                LOCK();
                (local_e0->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_e0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_e0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_e0,2,0x10);
                }
              }
              local_f4 = iVar11 + iVar10;
              bVar2 = false;
              lVar15 = lVar5;
              psVar14 = psVar4;
              local_e0 = pQVar3;
            }
            QTextFormat::~QTextFormat((QTextFormat *)&local_c8);
            if (!bVar2) break;
          } while ((int)local_88 != uStack_90._4_4_);
        }
        if (local_f4 != ~MoveAnchor) {
          if ((int)local_88 != uStack_90._4_4_) {
            local_d8 = ~MoveAnchor;
            goto LAB_004d09ca;
          }
        }
        QTextBlock::previous();
        local_68 = local_b8;
        puStack_60 = (undefined1 *)CONCAT44(puStack_60._4_4_,psStack_b0._0_4_);
        QTextBlock::end();
        local_88 = (undefined1 *)CONCAT44(local_88._4_4_,(int)local_a8);
        local_98 = (undefined1  [8])local_b8;
        uStack_90 = psStack_b0;
        QTextBlock::begin();
        if (local_98 == (undefined1  [8])local_b8) {
          if ((int)local_88 != (int)local_a8) goto LAB_004d0760;
        }
        else {
LAB_004d0760:
          QTextBlock::iterator::operator--((iterator *)local_98);
        }
        QTextBlock::begin();
        local_48 = (undefined1 *)CONCAT44(local_48._4_4_,(int)local_a8);
        local_58._0_8_ = local_b8;
        stack0xffffffffffffffb0 = psStack_b0;
        cVar8 = QTextBlock::isValid();
      } while (cVar8 != '\0');
    }
  }
  else {
    iVar10 = QTextCursor::selectionEnd();
    local_b8 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    psStack_b0 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
    QTextDocument::findBlock((int)&local_b8);
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xffffffffffffffb0 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
    QTextBlock::begin();
    if ((int)local_48 != iStack_4c) {
      do {
        QTextBlock::iterator::fragment();
        iVar11 = QTextFragment::position();
        if (iVar10 <= iVar11) break;
        QTextBlock::iterator::operator++((iterator *)local_58);
      } while ((int)local_48 != iStack_4c);
    }
    cVar8 = QTextBlock::isValid();
    if (cVar8 == '\0') {
      local_f4 = ~MoveAnchor;
      local_e0 = (QArrayData *)0x0;
      local_d8 = ~MoveAnchor;
      goto LAB_004d07c0;
    }
    local_e0 = (QArrayData *)0x0;
    psVar14 = (storage_type_conflict *)0x0;
    puVar16 = (undefined1 *)0x0;
    do {
      if ((int)local_48 == iStack_4c) {
        local_f4 = ~MoveAnchor;
      }
      else {
        local_f4 = ~MoveAnchor;
        do {
          local_68 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
          puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
          QTextBlock::iterator::fragment();
          local_78 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
          QTextFragment::charFormat();
          cVar8 = QTextFormat::boolProperty((int)&local_78);
          bVar2 = true;
          if ((cVar8 != '\0') && (cVar8 = QTextFormat::hasProperty((int)&local_78), cVar8 != '\0'))
          {
            local_f4 = QTextFragment::position();
            QTextFormat::stringProperty((int)local_98);
            puVar7 = local_88;
            psVar4 = uStack_90;
            auVar6 = local_98;
            local_98 = (undefined1  [8])local_e0;
            uStack_90 = psVar14;
            local_88 = puVar16;
            if (local_e0 != (QArrayData *)0x0) {
              LOCK();
              (local_e0->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_e0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_e0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_e0,2,0x10);
              }
            }
            bVar2 = false;
            local_e0 = (QArrayData *)auVar6;
            psVar14 = psVar4;
            puVar16 = puVar7;
          }
          QTextFormat::~QTextFormat((QTextFormat *)&local_78);
          if (!bVar2) break;
          QTextBlock::iterator::operator++((iterator *)local_58);
        } while ((int)local_48 != iStack_4c);
      }
      if (local_f4 != ~MoveAnchor) {
        local_d8 = ~MoveAnchor;
        if ((int)local_48 == iStack_4c) goto LAB_004d097c;
        local_d8 = ~MoveAnchor;
        goto LAB_004d0889;
      }
      QTextBlock::next();
      local_b8 = (QArrayData *)local_98;
      psStack_b0 = (storage_type_conflict *)CONCAT44(psStack_b0._4_4_,(int)uStack_90);
      QTextBlock::begin();
      local_48 = (undefined1 *)CONCAT44(local_48._4_4_,(int)local_88);
      local_58._0_8_ = local_98;
      stack0xffffffffffffffb0 = uStack_90;
      cVar8 = QTextBlock::isValid();
    } while (cVar8 != '\0');
    local_f4 = ~MoveAnchor;
  }
  local_d8 = ~MoveAnchor;
  goto LAB_004d07c0;
  while( true ) {
    if ((int)local_88 == uStack_90._4_4_) break;
LAB_004d09ca:
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    QTextBlock::iterator::fragment();
    local_c8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
    QTextFragment::charFormat();
    cVar8 = QTextFormat::boolProperty((int)(QTextFormat *)&local_c8);
    bVar9 = 1;
    if ((cVar8 != '\0') && (QTextFormat::stringProperty((int)&local_b8), local_a8 == lVar15)) {
      QVar18.m_data = psStack_b0;
      QVar18.m_size = local_a8;
      QVar20.m_data = psVar14;
      QVar20.m_size = lVar15;
      bVar9 = QtPrivate::equalStrings(QVar18,QVar20);
      bVar9 = bVar9 ^ 1;
    }
    if ((cVar8 != '\0') && (local_b8 != (QArrayData *)0x0)) {
      LOCK();
      (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_b8,2,0x10);
      }
    }
    if (bVar9 == 0) {
      if (local_98 == (undefined1  [8])local_58._0_8_) {
        if ((int)local_88 == (int)local_48) {
          local_98 = (undefined1  [8])0x0;
          uStack_90 = (storage_type_conflict *)0x0;
          local_88 = (undefined1 *)((ulong)local_88 & 0xffffffff00000000);
          goto LAB_004d0ac9;
        }
      }
      QTextBlock::iterator::operator--((iterator *)local_98);
    }
    else {
      iVar10 = QTextFragment::position();
      iVar11 = QTextFragment::length();
      local_d8 = iVar11 + iVar10;
    }
LAB_004d0ac9:
    QTextFormat::~QTextFormat((QTextFormat *)&local_c8);
    if (bVar9 != 0) break;
  }
  if (local_d8 == ~MoveAnchor) {
    MVar13 = QTextBlock::position();
    local_d8 = MoveAnchor;
    if (0 < (int)MVar13) {
      local_d8 = MVar13;
    }
  }
  goto LAB_004d07c0;
  while( true ) {
    QTextBlock::iterator::operator++((iterator *)local_58);
    if ((int)local_48 == iStack_4c) break;
LAB_004d0889:
    local_68 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    QTextBlock::iterator::fragment();
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    QTextFragment::charFormat();
    cVar8 = QTextFormat::boolProperty((int)(QTextFormat *)&local_78);
    bVar9 = 1;
    if ((cVar8 != '\0') && (QTextFormat::stringProperty((int)local_98), local_88 == puVar16)) {
      QVar17.m_data = uStack_90;
      QVar17.m_size = (qsizetype)local_88;
      QVar19.m_data = psVar14;
      QVar19.m_size = (qsizetype)puVar16;
      bVar9 = QtPrivate::equalStrings(QVar17,QVar19);
      bVar9 = bVar9 ^ 1;
    }
    if ((cVar8 != '\0') && (local_98 != (undefined1  [8])0x0)) {
      LOCK();
      (((QBasicAtomicInt *)local_98)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_98)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_98)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_98,2,0x10);
      }
    }
    if (bVar9 != 0) {
      local_d8 = QTextFragment::position();
    }
    QTextFormat::~QTextFormat((QTextFormat *)&local_78);
    if (bVar9 != 0) break;
  }
LAB_004d097c:
  if (local_d8 == ~MoveAnchor) {
    iVar10 = QTextBlock::position();
    iVar11 = QTextBlock::length();
    local_d8 = (iVar10 + iVar11) - KeepAnchor;
  }
LAB_004d07c0:
  if (local_d8 != ~MoveAnchor && local_f4 != ~MoveAnchor) {
    QTextCursor::operator=(newAnchor,(QTextCursor *)(lVar1 + 0x88));
    QTextCursor::setPosition((int)newAnchor,local_f4);
    QTextCursor::setPosition((int)newAnchor,local_d8);
  }
  if (local_e0 != (QArrayData *)0x0) {
    LOCK();
    (local_e0->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_e0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_e0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_e0,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_d8 != ~MoveAnchor && local_f4 != ~MoveAnchor;
}

Assistant:

bool QWidgetTextControl::findNextPrevAnchor(const QTextCursor &startCursor, bool next, QTextCursor &newAnchor)
{
    Q_D(QWidgetTextControl);

    int anchorStart = -1;
    QString anchorHref;
    int anchorEnd = -1;

    if (next) {
        const int startPos = startCursor.selectionEnd();

        QTextBlock block = d->doc->findBlock(startPos);
        QTextBlock::Iterator it = block.begin();

        while (!it.atEnd() && it.fragment().position() < startPos)
            ++it;

        while (block.isValid()) {
            anchorStart = -1;

            // find next anchor
            for (; !it.atEnd(); ++it) {
                const QTextFragment fragment = it.fragment();
                const QTextCharFormat fmt = fragment.charFormat();

                if (fmt.isAnchor() && fmt.hasProperty(QTextFormat::AnchorHref)) {
                    anchorStart = fragment.position();
                    anchorHref = fmt.anchorHref();
                    break;
                }
            }

            if (anchorStart != -1) {
                anchorEnd = -1;

                // find next non-anchor fragment
                for (; !it.atEnd(); ++it) {
                    const QTextFragment fragment = it.fragment();
                    const QTextCharFormat fmt = fragment.charFormat();

                    if (!fmt.isAnchor() || fmt.anchorHref() != anchorHref) {
                        anchorEnd = fragment.position();
                        break;
                    }
                }

                if (anchorEnd == -1)
                    anchorEnd = block.position() + block.length() - 1;

                // make found selection
                break;
            }

            block = block.next();
            it = block.begin();
        }
    } else {
        int startPos = startCursor.selectionStart();
        if (startPos > 0)
            --startPos;

        QTextBlock block = d->doc->findBlock(startPos);
        QTextBlock::Iterator blockStart = block.begin();
        QTextBlock::Iterator it = block.end();

        if (startPos == block.position()) {
            it = block.begin();
        } else {
            do {
                if (it == blockStart) {
                    it = QTextBlock::Iterator();
                    block = QTextBlock();
                } else {
                    --it;
                }
            } while (!it.atEnd() && it.fragment().position() + it.fragment().length() - 1 > startPos);
        }

        while (block.isValid()) {
            anchorStart = -1;

            if (!it.atEnd()) {
                do {
                    const QTextFragment fragment = it.fragment();
                    const QTextCharFormat fmt = fragment.charFormat();

                    if (fmt.isAnchor() && fmt.hasProperty(QTextFormat::AnchorHref)) {
                        anchorStart = fragment.position() + fragment.length();
                        anchorHref = fmt.anchorHref();
                        break;
                    }

                    if (it == blockStart)
                        it = QTextBlock::Iterator();
                    else
                        --it;
                } while (!it.atEnd());
            }

            if (anchorStart != -1 && !it.atEnd()) {
                anchorEnd = -1;

                do {
                    const QTextFragment fragment = it.fragment();
                    const QTextCharFormat fmt = fragment.charFormat();

                    if (!fmt.isAnchor() || fmt.anchorHref() != anchorHref) {
                        anchorEnd = fragment.position() + fragment.length();
                        break;
                    }

                    if (it == blockStart)
                        it = QTextBlock::Iterator();
                    else
                        --it;
                } while (!it.atEnd());

                if (anchorEnd == -1)
                    anchorEnd = qMax(0, block.position());

                break;
            }

            block = block.previous();
            it = block.end();
            if (it != block.begin())
                --it;
            blockStart = block.begin();
        }

    }

    if (anchorStart != -1 && anchorEnd != -1) {
        newAnchor = d->cursor;
        newAnchor.setPosition(anchorStart);
        newAnchor.setPosition(anchorEnd, QTextCursor::KeepAnchor);
        return true;
    }

    return false;
}